

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *__s;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  basic_fp<unsigned___int128> value_00;
  uint64_t divisor;
  size_t sVar4;
  result rVar5;
  round_direction rVar6;
  type tVar7;
  decimal_fp<float> dVar8;
  byte bVar9;
  uint uVar10;
  undefined8 extraout_RDX;
  long lVar11;
  size_t count;
  ulong uVar12;
  uint64_t error;
  uint uVar13;
  int iVar14;
  int num_digits;
  uint uVar15;
  uint64_t *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  basic_fp<unsigned_long_long> bVar23;
  fp fVar24;
  decimal_fp<double> dVar25;
  ulong uStackY_d0;
  int local_a4;
  ulong local_a0;
  gen_digits_handler handler;
  undefined8 uStack_80;
  int cached_exp10;
  double local_60;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  basic_fp<unsigned_long_long> local_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xc1e,"value is negative");
  }
  local_a0 = (ulong)specs & 0xff00000000;
  bVar20 = local_a0 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && local_a0 == 0x200000000) {
      tVar7 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar7);
      __s = buf->ptr_;
      tVar7 = to_unsigned<int>(precision);
      memset(__s,0x30,(ulong)tVar7);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  uVar13 = specs._4_4_;
  if (precision < 0) {
    if ((uVar13 >> 0x12 & 1) == 0) {
      dVar25 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v9::appender,_unsigned_long,_0>((appender)buf,dVar25.significand);
      return dVar25.exponent;
    }
    dVar8 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v9::appender,_unsigned_int,_0>((appender)buf,dVar8.significand);
    return dVar8.exponent;
  }
  cached_exp10 = 0;
  local_60 = value;
  basic_fp<unsigned_long_long>::assign<double,_0>(&local_40,value);
  bVar23.f = (ulong)(uint)local_40.e;
  bVar23._8_8_ = extraout_RDX;
  bVar23 = normalize<0,unsigned_long_long>((detail *)local_40.f,bVar23);
  fVar24 = get_cached_power(-0x7c - bVar23.e,&cached_exp10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = fVar24.f;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = bVar23.f;
  uVar19 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
  handler.buf = buf->ptr_;
  iVar14 = fVar24.e + bVar23.e;
  handler._8_8_ = (ulong)(uint)precision << 0x20;
  handler.exp10 = -cached_exp10;
  bVar9 = -(char)iVar14;
  local_58 = 1L << (bVar9 & 0x3f);
  handler.fixed = bVar20;
  uVar12 = uVar19 >> (bVar9 & 0x3f);
  if ((uint)uVar12 == 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xa40,"");
  }
  if (uVar12 >> 0x20 != 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xa41,"");
  }
  uVar10 = (uint)uVar12 | 1;
  uVar15 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar18 = uVar12 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar15 * 8);
  uVar15 = -iVar14 - 0x40;
  uVar17 = uVar18 >> 0x20;
  iVar14 = (int)(uVar18 >> 0x20);
  if (local_a0 == 0x200000000) {
    adjust_precision(&handler.precision,iVar14 - cached_exp10);
    if (0 < handler.precision) goto LAB_0028f1f4;
    if ((long)handler._8_8_ < 0) goto LAB_0028f4fa;
    rVar6 = get_round_direction(basic_data<void>::power_of_10_64
                                [(long)(uVar18 - 0x100000000) >> 0x20] << ((byte)uVar15 & 0x3f),
                                uVar19 / 10,10);
    if (rVar6 != unknown) {
      lVar11 = (long)handler.size;
      handler.size = handler.size + 1;
      handler.buf[lVar11] = rVar6 == up | 0x30;
      goto LAB_0028f4fa;
    }
    uVar21 = SUB84(local_60,0);
    uVar22 = (undefined4)((ulong)local_60 >> 0x20);
  }
  else {
LAB_0028f1f4:
    local_48 = local_58 - 1;
    uVar19 = uVar19 & local_48;
    puVar16 = basic_data<void>::power_of_10_64 + (iVar14 - 1);
    error = 1;
    local_50 = (ulong)uVar15;
    do {
      uVar15 = (uint)uVar17;
      switch(uVar15 - 1) {
      case 0:
        cVar3 = (char)uVar12;
        uVar12 = 0;
        goto LAB_0028f2a2;
      case 1:
        uStackY_d0 = 10;
        break;
      case 2:
        uStackY_d0 = 100;
        break;
      case 3:
        uStackY_d0 = 1000;
        break;
      case 4:
        uStackY_d0 = 10000;
        break;
      case 5:
        uStackY_d0 = 100000;
        break;
      case 6:
        uStackY_d0 = 1000000;
        break;
      case 7:
        uStackY_d0 = 10000000;
        break;
      case 8:
        uStackY_d0 = 100000000;
        break;
      case 9:
        uStackY_d0 = 1000000000;
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                    ,0xa7e,"invalid number of digits");
      }
      cVar3 = (char)((uVar12 & 0xffffffff) / uStackY_d0);
      uVar12 = (uVar12 & 0xffffffff) % uStackY_d0;
LAB_0028f2a2:
      rVar5 = gen_digits_handler::on_digit
                        (&handler,cVar3 + '0',*puVar16 << ((byte)local_50 & 0x3f),
                         (uVar12 << ((byte)local_50 & 0x3f)) + uVar19,1,true);
      uVar18 = local_50;
      divisor = local_58;
      if (rVar5 != more) {
        iVar14 = uVar15 - 1;
        goto LAB_0028f3bf;
      }
      puVar16 = puVar16 + -1;
      uVar17 = (ulong)(uVar15 - 1);
    } while (1 < uVar15);
    iVar14 = 0;
    do {
      uVar12 = uVar19 * 10;
      error = error * 10;
      uVar19 = uVar12 & local_48;
      iVar14 = iVar14 + -1;
      local_a4 = iVar14;
      rVar5 = gen_digits_handler::on_digit
                        (&handler,(char)(uVar12 >> ((byte)uVar18 & 0x3f)) + '0',divisor,uVar19,error
                         ,false);
    } while (rVar5 == more);
LAB_0028f3bf:
    uVar21 = SUB84(local_60,0);
    uVar22 = (undefined4)((ulong)local_60 >> 0x20);
    if (rVar5 != error) {
LAB_0028f4fa:
      uVar12 = local_a0;
      local_a4 = iVar14 + handler.exp10;
      tVar7 = to_unsigned<int>(handler.size);
      buffer<char>::try_resize(buf,(ulong)tVar7);
      goto LAB_0028f51c;
    }
  }
  uVar12 = local_a0;
  local_a4 = ~cached_exp10 + handler.size + iVar14;
  iVar14 = handler.precision;
  handler.buf = (char *)0x0;
  handler.size = 0;
  handler.precision = 0;
  handler.exp10 = 0;
  if ((uVar13 >> 0x12 & 1) == 0) {
    bVar20 = basic_fp<unsigned___int128>::assign<double,_0>
                       ((basic_fp<unsigned___int128> *)&handler,(double)CONCAT44(uVar22,uVar21));
  }
  else {
    bVar20 = basic_fp<unsigned___int128>::assign<float,_0>
                       ((basic_fp<unsigned___int128> *)&handler,
                        (float)(double)CONCAT44(uVar22,uVar21));
  }
  uVar15 = bVar20 + 4;
  if (uVar12 != 0x200000000) {
    uVar15 = (uint)bVar20;
  }
  num_digits = 0x2ff;
  if (iVar14 < 0x2ff) {
    num_digits = iVar14;
  }
  value_00._20_1_ = handler.fixed;
  value_00._21_3_ = handler._21_3_;
  value_00.e = handler.exp10;
  value_00.f._8_4_ = handler.size;
  value_00.f._12_4_ = handler.precision;
  value_00.f._0_8_ = handler.buf;
  value_00._24_8_ = uStack_80;
  format_dragon(value_00,uVar15,num_digits,buf,&local_a4);
LAB_0028f51c:
  if ((uVar13 >> 0x13 & 1) == 0 && uVar12 != 0x200000000) {
    sVar4 = buf->size_;
    iVar14 = local_a4;
    do {
      local_a4 = iVar14;
      count = sVar4;
      if (count == 0) break;
      sVar4 = count - 1;
      iVar14 = local_a4 + 1;
    } while (buf->ptr_[count - 1] == '0');
    buffer<char>::try_resize(buf,count);
  }
  return local_a4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}